

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_parse_data_(ly_ctx *ctx,char *data,LYD_FORMAT format,int options,__va_list_tag *ap)

{
  lyd_node **pplVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  LY_ERR *pLVar6;
  lyd_node *plVar7;
  char *format_00;
  lyd_node *plVar8;
  char *pcVar9;
  lyd_node *plVar10;
  lyxml_elem *local_40;
  char *local_38;
  
  iVar3 = lyp_data_check_options(ctx,options,"lyd_parse_data_");
  if (iVar3 != 0) {
    return (lyd_node *)0x0;
  }
  if ((options & 0x20U) != 0) {
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar4 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      plVar4 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar4 + 1;
    }
    plVar7 = (lyd_node *)*plVar4;
    if (((plVar7 != (lyd_node *)0x0) && (plVar7->parent == (lyd_node *)0x0)) &&
       ((plVar7->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN))
    goto LAB_001642c0;
    format_00 = "%s: invalid variable parameter (const struct lyd_node *rpc_act).";
    goto LAB_0016446b;
  }
  plVar7 = (lyd_node *)0x0;
LAB_001642c0:
  if ((options & 0x70U) == 0) {
LAB_00164389:
    plVar8 = (lyd_node *)0x0;
  }
  else {
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      plVar4 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      plVar4 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar4 + 1;
    }
    plVar10 = (lyd_node *)*plVar4;
    if (plVar10 == (lyd_node *)0x0) goto LAB_00164389;
    plVar8 = plVar10;
    if ((short)options < 0) {
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
      ;
LAB_0016446b:
      pcVar9 = "lyd_parse_data_";
      goto LAB_00164478;
    }
    do {
      if (plVar8->parent != (lyd_node *)0x0) {
        format_00 = "%s: invalid variable parameter (const struct lyd_node *data_tree).";
        goto LAB_0016446b;
      }
      pplVar1 = &plVar8->next;
      plVar8 = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      plVar8 = plVar10;
      plVar10 = plVar8->prev;
    } while (plVar8->prev->next != (lyd_node *)0x0);
    if (((uint)options >> 0xc & 1) != 0) {
      format_00 = 
      "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
      ;
      local_38 = data;
      goto LAB_0016446b;
    }
  }
  if (((uint)options >> 0x18 & 1) == 0) {
    plVar10 = (lyd_node *)0x0;
  }
  else {
    uVar2 = ap->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      puVar5 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar5 + 1;
    }
    plVar10 = (lyd_node *)*puVar5;
  }
  if (ctx == (ly_ctx *)0x0 || data == (char *)0x0) {
    format_00 = "Invalid arguments (%s()).";
    pcVar9 = "lyd_parse_";
    ctx = (ly_ctx *)0x0;
    local_38 = data;
LAB_00164478:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format_00,pcVar9);
    return (lyd_node *)0x0;
  }
  local_38 = data;
  pLVar6 = ly_errno_glob_address();
  *pLVar6 = LY_SUCCESS;
  if (format == LYD_LYB) {
    plVar7 = lyd_parse_lyb(ctx,local_38,options,plVar8,(char *)plVar10,(int *)0x0);
  }
  else if (format == LYD_JSON) {
    plVar7 = lyd_parse_json(ctx,local_38,options,plVar7,plVar8,(char *)plVar10);
  }
  else {
    if (format == LYD_XML) {
      local_40 = lyxml_parse_mem(ctx,local_38,(uint)(((uint)options >> 0xc & 1) == 0));
      pLVar6 = ly_errno_glob_address();
      if (*pLVar6 == LY_SUCCESS) {
        if ((options & 0x20U) == 0) {
          if (((options & 0x50U) == 0) && (plVar8 = plVar10, ((uint)options >> 0x18 & 1) == 0)) {
            plVar7 = lyd_parse_xml(ctx,&local_40,options);
          }
          else {
            plVar7 = lyd_parse_xml(ctx,&local_40,options,plVar8);
          }
        }
        else {
          plVar7 = lyd_parse_xml(ctx,&local_40,options,plVar7,plVar8);
        }
        lyxml_free_withsiblings(ctx,local_40);
        goto LAB_001644ce;
      }
    }
    plVar7 = (lyd_node *)0x0;
  }
LAB_001644ce:
  pLVar6 = ly_errno_glob_address();
  if (*pLVar6 != LY_SUCCESS) {
    lyd_free_withsiblings(plVar7);
    return (lyd_node *)0x0;
  }
  return plVar7;
}

Assistant:

static struct lyd_node *
lyd_parse_data_(struct ly_ctx *ctx, const char *data, LYD_FORMAT format, int options, va_list ap)
{
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL, *iter;
    const char *yang_data_name = NULL;

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            return NULL;
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                return NULL;
            }

            LY_TREE_FOR(data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    return NULL;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                return NULL;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    return lyd_parse_(ctx, rpc_act, data, format, options, data_tree, yang_data_name);
}